

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O0

void __thiscall t_html_generator::print_doc(t_html_generator *this,t_doc *tdoc)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  string local_38;
  t_doc *local_18;
  t_doc *tdoc_local;
  t_html_generator *this_local;
  
  local_18 = tdoc;
  tdoc_local = (t_doc *)this;
  bVar1 = t_doc::has_doc(tdoc);
  if (bVar1) {
    if ((this->unsafe_ & 1U) == 0) {
      poVar3 = std::operator<<((ostream *)&this->f_out_,"<pre>");
      psVar2 = t_doc::get_doc_abi_cxx11_(local_18);
      escape_html(&local_38,this,psVar2);
      poVar3 = std::operator<<(poVar3,(string *)&local_38);
      std::operator<<(poVar3,"</pre><br/>");
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      psVar2 = t_doc::get_doc_abi_cxx11_(local_18);
      poVar3 = std::operator<<((ostream *)&this->f_out_,(string *)psVar2);
      std::operator<<(poVar3,"<br/>");
    }
  }
  return;
}

Assistant:

void t_html_generator::print_doc(t_doc* tdoc) {
  if (tdoc->has_doc()) {
    if (unsafe_) {
      f_out_ << tdoc->get_doc() << "<br/>";
    } else {
      f_out_ << "<pre>" << escape_html(tdoc->get_doc()) << "</pre><br/>";
    }
  }
}